

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t driver::zeImageGetDeviceOffsetExp(ze_image_handle_t hImage,uint64_t *pDeviceOffset)

{
  ze_result_t zVar1;
  
  if (DAT_0010e480 != (code *)0x0) {
    zVar1 = (*DAT_0010e480)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeImageGetDeviceOffsetExp(
        ze_image_handle_t hImage,                       ///< [in] handle of the image
        uint64_t* pDeviceOffset                         ///< [out] bindless device offset for image
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetDeviceOffsetExp = context.zeDdiTable.ImageExp.pfnGetDeviceOffsetExp;
        if( nullptr != pfnGetDeviceOffsetExp )
        {
            result = pfnGetDeviceOffsetExp( hImage, pDeviceOffset );
        }
        else
        {
            // generic implementation
        }

        return result;
    }